

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.cc
# Opt level: O2

int filesystem::copy(path *from,path *to)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  string asStack_448 [32];
  ofstream dst;
  ifstream src;
  streambuf local_218 [504];
  
  bVar1 = exists(from);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    bVar1 = exists(to);
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
    if (!bVar1) {
      path::parent_path((path *)&src,to);
      bVar1 = create_directories((path *)&src);
      iVar2 = std::__cxx11::string::~string((string *)&src);
      if (bVar1) {
        std::__cxx11::string::string((string *)&dst,(string *)from);
        std::ifstream::ifstream(&src,(string *)&dst,_S_in);
        std::__cxx11::string::~string((string *)&dst);
        std::__cxx11::string::string(asStack_448,(string *)to);
        std::ofstream::ofstream(&dst,asStack_448,_S_out);
        std::__cxx11::string::~string(asStack_448);
        std::ostream::operator<<(&dst,local_218);
        std::ofstream::~ofstream(&dst);
        iVar2 = std::ifstream::~ifstream(&src);
      }
    }
  }
  return iVar2;
}

Assistant:

void ::filesystem::copy(const path& from, const path& to)
{
    if (!::filesystem::exists(from)) {
        return;
    }

    if (!::filesystem::exists(to)) {
        if (::filesystem::create_directories(to.parent_path())) {
            ifstream src(from.string());
            ofstream dst(to.string());

            dst << src.rdbuf();
        }
    }
}